

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O3

int __thiscall Confparse::Load(Confparse *this,path *filepath,bool save_default)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ostream *poVar5;
  ifstream file;
  ofstream file_1;
  char local_430 [8];
  size_t local_428;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ifstream::ifstream(local_430);
  std::ifstream::open(local_430,(_Ios_Openmode)(filepath->_M_pathname)._M_dataplus._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    this->buffer_size = 0;
    this->conf = (char *)0x0;
    iVar2 = 1;
    if (this->nested == false) {
      if (save_default) {
        iVar2 = SaveDefault(this,filepath);
      }
      else {
        std::ofstream::ofstream(&local_228);
        std::ofstream::open((char *)&local_228,
                            (_Ios_Openmode)(filepath->_M_pathname)._M_dataplus._M_p);
        this->nested = true;
        std::ofstream::close();
        iVar2 = Load(this,filepath,false);
        local_228 = _VTT;
        *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _roundf;
        std::filebuf::~filebuf(local_220);
        std::ios_base::~ios_base(local_130);
      }
    }
  }
  else {
    std::filesystem::__cxx11::path::operator=(&this->filepath,filepath);
    if (this->conf != (char *)0x0) {
      free(this->conf);
    }
    sVar3 = std::istream::tellg();
    this->buffer_size = sVar3;
    pcVar4 = (char *)calloc(1,sVar3 + 1);
    this->conf = pcVar4;
    std::istream::seekg((long)local_430,_S_beg);
    std::istream::read(local_430,(long)this->conf);
    this->limit = this->conf + sVar3;
    std::ifstream::close();
    if (local_428 == sVar3) {
      this->nested = false;
      iVar2 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Did not read the right number of bytes from configuration file ",0x3f);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      iVar2 = 1;
      std::ostream::flush();
    }
  }
  std::ifstream::~ifstream(local_430);
  return iVar2;
}

Assistant:

int Confparse::Load(const filesystem::path &filepath, bool save_default) {
	ifstream file;
	file.open(filepath, std::ios::in | std::ios::binary | std::ios::ate);
	if (!file.is_open()) {
		//		std::cerr << "Error opening " << filepath.string() << ": " <<
		// strerror(errno) << std::endl;
		buffer_size = 0;
		conf        = NULL;
		if (nested) return 1; // to prevent infinite recursion, we test the nested flag
		if (save_default) { // Create file with default OBV configuration
			return (SaveDefault(filepath));
		} else { // Create empty file
			ofstream file;
			file.open(filepath, std::ios::out | std::ios::binary | std::ios::ate);
			nested = true;
			file.close();
			return Load(filepath);
		}
	}

	this->filepath = filepath;

	if (conf) free(conf);

	std::streampos sz = file.tellg();
	buffer_size       = sz;
	conf              = (char *)calloc(1, buffer_size + 1);
	file.seekg(0, std::ios::beg);
	file.read(conf, sz);
	limit = conf + sz;
	file.close();

	if (file.gcount() != sz) {
		std::cerr << "Did not read the right number of bytes from configuration file " << file.gcount() << " != " << sz << std::endl;
		return 1;
	}
	//	assert(file.gcount() == sz);
	//
	//

	nested = false;

	return 0;
}